

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

handle pybind11::detail::tuple_caster<std::pair,bool,std::__cxx11::string>::
       cast_impl<std::pair<bool,std::__cxx11::string>,0ul,1ul>
                 (char *src,return_value_policy policy,handle parent)

{
  undefined8 uVar1;
  long lVar2;
  handle hVar3;
  handle local_30;
  tuple result;
  array<pybind11::object,_2UL> entries;
  
  if (*src == '\0') {
    result.super_object.super_handle.m_ptr = (object)&_Py_FalseStruct;
  }
  else {
    result.super_object.super_handle.m_ptr = (object)&_Py_TrueStruct;
  }
  *(long *)result.super_object.super_handle.m_ptr =
       *(long *)result.super_object.super_handle.m_ptr + 1;
  string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ::cast((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(src + 8),policy,
         parent);
  hVar3.m_ptr = (PyObject *)0x0;
  lVar2 = 0;
  do {
    if (*(long *)((long)(entries._M_elems + -1) + lVar2) == 0) goto LAB_002c9dc3;
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x10);
  tuple::tuple<unsigned_long,_0>((tuple *)&local_30,2);
  hVar3.m_ptr = local_30.m_ptr;
  lVar2 = 0;
  do {
    uVar1 = *(undefined8 *)((long)(entries._M_elems + -1) + lVar2);
    *(undefined8 *)((long)(entries._M_elems + -1) + lVar2) = 0;
    if (((local_30.m_ptr)->ob_type->tp_flags & 0x4000000) == 0) {
      __assert_fail("PyTuple_Check(result.ptr())",
                    "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/pybind11/include/pybind11/cast.h"
                    ,0x280,
                    "static handle pybind11::detail::tuple_caster<std::pair, bool, std::basic_string<char>>::cast_impl(T &&, return_value_policy, handle, index_sequence<Is...>) [Tuple = std::pair, Ts = <bool, std::basic_string<char>>, T = std::pair<bool, std::basic_string<char>>, Is = <0UL, 1UL>]"
                   );
    }
    *(undefined8 *)((long)&local_30.m_ptr[1].ob_type + lVar2) = uVar1;
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x10);
  local_30.m_ptr = (PyObject *)0x0;
  object::~object((object *)&local_30);
LAB_002c9dc3:
  lVar2 = 8;
  do {
    object::~object((object *)((long)(entries._M_elems + -1) + lVar2));
    lVar2 = lVar2 + -8;
  } while (lVar2 != -8);
  return (handle)hVar3.m_ptr;
}

Assistant:

static handle cast_impl(T &&src, return_value_policy policy, handle parent, index_sequence<Is...>) {
        PYBIND11_WORKAROUND_INCORRECT_MSVC_C4100(src, policy, parent);
        PYBIND11_WORKAROUND_INCORRECT_GCC_UNUSED_BUT_SET_PARAMETER(policy, parent);
        std::array<object, size> entries{{
            reinterpret_steal<object>(make_caster<Ts>::cast(std::get<Is>(std::forward<T>(src)), policy, parent))...
        }};
        for (const auto &entry: entries)
            if (!entry)
                return handle();
        tuple result(size);
        int counter = 0;
        for (auto & entry: entries)
            PyTuple_SET_ITEM(result.ptr(), counter++, entry.release().ptr());
        return result.release();
    }